

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O1

void __thiscall higan::TcpConnection::OnReadable(TcpConnection *this)

{
  Buffer *this_00;
  int fd;
  ssize_t sVar1;
  undefined8 uVar2;
  Buffer *local_30;
  __shared_ptr<higan::TcpConnection,(__gnu_cxx::_Lock_policy)2> local_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  this_00 = &this->input_buffer_;
  fd = Socket::GetFd(&this->socket_);
  sVar1 = Buffer::ReadFromFd(this_00,fd);
  if (sVar1 == 0) {
    OnError(this);
    return;
  }
  if ((this->message_callback_).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::__shared_ptr<higan::TcpConnection,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<higan::TcpConnection,void>
              (local_28,(__weak_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)this);
    local_30 = this_00;
    if ((this->message_callback_).super__Function_base._M_manager == (_Manager_type)0x0) {
      uVar2 = std::__throw_bad_function_call();
      if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
      }
      _Unwind_Resume(uVar2);
    }
    (*(this->message_callback_)._M_invoker)
              ((_Any_data *)&this->message_callback_,(shared_ptr<higan::TcpConnection> *)local_28,
               &local_30);
    if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
    }
  }
  return;
}

Assistant:

void TcpConnection::OnReadable()
{
	ssize_t len = input_buffer_.ReadFromFd(socket_.GetFd());

	if (len == 0)
	{
		OnError();
	}
	else
	{
		if (message_callback_)
		{
			message_callback_(shared_from_this(), &input_buffer_);
		}
	}
}